

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atoi.h
# Opt level: O2

type_conflict3 jsteemann::atoi<unsigned_short>(char *p,char *e,bool *valid)

{
  unsigned_short uVar1;
  ushort uVar2;
  byte bVar3;
  bool bVar4;
  
  if ((p == e) || (*p == '-')) {
    *valid = false;
    return 0;
  }
  if (*p == '+') {
    uVar1 = atoi_positive<unsigned_short>(p + 1,e,valid);
    return uVar1;
  }
  if (p == e) {
    bVar4 = false;
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      if ((byte)(*p - 0x3aU) < 0xf6) {
LAB_00128fd4:
        bVar4 = false;
        goto LAB_00128fd1;
      }
      bVar3 = *p - 0x30;
      if ((0x1999 < uVar2) || (uVar2 == 0x1999 && 5 < bVar3)) goto LAB_00128fd4;
      uVar2 = (ushort)bVar3 + uVar2 * 10;
      p = p + 1;
    } while (p < e);
    bVar4 = true;
  }
LAB_00128fd1:
  *valid = bVar4;
  return uVar2;
}

Assistant:

inline typename std::enable_if<std::is_unsigned<T>::value, T>::type atoi(char const* p, char const* e, bool& valid) noexcept {
  if (ATOI_UNLIKELY(p == e)) {
    valid = false;
    return T();
  }

  if (*p == '-') {
    valid = false;
    return T();
  } 
  if (ATOI_UNLIKELY(*p == '+')) {
    ++p;
  }
  
  return atoi_positive<T>(p, e, valid);
}